

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O0

Index __thiscall
TwoStageDynamicBayesianNetwork::IndividualToJointOiiIndices
          (TwoStageDynamicBayesianNetwork *this,Index o,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *As,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Ys,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Os)

{
  Index IVar1;
  iterator __position;
  iterator __last;
  const_iterator this_00;
  uint in_ESI;
  long in_RDI;
  Index iiI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff28;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *this_01;
  size_t *step_size;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indices;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff70;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff78;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffff88;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xaf3b97);
  this_01 = *(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              **)(in_RDI + 0x2d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            (this_01,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff28);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78);
  step_size = *(size_t **)(in_RDI + 0x2d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            (this_01,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff28);
  __position = std::vector<unsigned_int,std::allocator<unsigned_int>>::
               insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff88,
                          in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  indices = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x2d0);
  __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
  __normal_iterator<unsigned_int*>
            (this_01,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)in_stack_ffffffffffffff28);
  this_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                      (in_stack_ffffffffffffff28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(in_stack_ffffffffffffff28);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_current,
             (const_iterator)__position._M_current,in_stack_ffffffffffffff80,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )__last._M_current);
  std::vector<unsigned_long_*,_std::allocator<unsigned_long_*>_>::operator[]
            ((vector<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)(in_RDI + 0x2d8),
             (ulong)in_ESI);
  IVar1 = IndexTools::IndividualToJointIndicesStepSize(indices,step_size);
  return IVar1;
}

Assistant:

Index TwoStageDynamicBayesianNetwork::
IndividualToJointOiiIndices(Index o, 
        const vector<Index>& As, 
        const vector<Index>& Ys, 
        const vector<Index>& Os) const
{
    _m_IndividualToJointOiiIndices_catVector->clear();
    _m_IndividualToJointOiiIndices_catVector->insert(
        _m_IndividualToJointOiiIndices_catVector->end(), As.begin(), As.end() );
    _m_IndividualToJointOiiIndices_catVector->insert(
        _m_IndividualToJointOiiIndices_catVector->end(), Ys.begin(), Ys.end() );
    _m_IndividualToJointOiiIndices_catVector->insert(
        _m_IndividualToJointOiiIndices_catVector->end(), Os.begin(), Os.end() );

    Index iiI = IndexTools::IndividualToJointIndicesStepSize(
        *_m_IndividualToJointOiiIndices_catVector,
        _m_nrVals_SoI_O_stepsize[o] );
    return iiI;

}